

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OmegaOP.cpp
# Opt level: O1

void __thiscall OmegaOP::backtracking(OmegaOP *this,uint n)

{
  uint *puVar1;
  int iVar2;
  double **ppdVar3;
  iterator iVar4;
  iterator iVar5;
  pointer piVar6;
  pointer piVar7;
  pointer pdVar8;
  pointer pdVar9;
  undefined8 in_RAX;
  int *piVar10;
  double *pdVar11;
  pointer piVar12;
  pointer pdVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  double dVar17;
  undefined8 local_38;
  
  uVar14 = (ulong)n;
  uVar16 = 0;
  ppdVar3 = this->Q;
  if (1 < (ulong)this->nbStates) {
    dVar17 = (*ppdVar3)[n];
    uVar16 = 0;
    uVar15 = 1;
    do {
      if (ppdVar3[uVar15][n] < dVar17) {
        uVar16 = uVar15 & 0xffffffff;
        dVar17 = ppdVar3[uVar15][n];
      }
      uVar15 = uVar15 + 1;
    } while (this->nbStates != uVar15);
  }
  this->globalCost = ppdVar3[uVar16][n];
  local_38 = in_RAX;
  if (1 < n) {
    do {
      local_38 = CONCAT44((int)uVar14,(int)local_38);
      iVar4._M_current =
           (this->changepoints).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar4._M_current ==
          (this->changepoints).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&this->changepoints,iVar4,(int *)((long)&local_38 + 4));
      }
      else {
        *iVar4._M_current = (int)uVar14;
        (this->changepoints).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar4._M_current + 1;
      }
      iVar5._M_current =
           (this->parameters).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (this->parameters).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)&this->parameters,iVar5,
                   this->states + uVar16);
      }
      else {
        *iVar5._M_current = this->states[uVar16];
        (this->parameters).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar5._M_current + 1;
      }
      puVar1 = this->lastChpt[uVar16] + uVar14;
      uVar14 = (ulong)*puVar1;
      uVar16 = (ulong)this->lastIndState[uVar16]
                      [(this->changepoints).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish[-1]];
    } while (1 < *puVar1);
  }
  local_38 = CONCAT44(local_38._4_4_,1);
  iVar4._M_current =
       (this->changepoints).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar4._M_current ==
      (this->changepoints).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&this->changepoints,iVar4,(int *)&local_38);
  }
  else {
    *iVar4._M_current = 1;
    (this->changepoints).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar4._M_current + 1;
  }
  iVar5._M_current =
       (this->parameters).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar5._M_current ==
      (this->parameters).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
              ((vector<double,std::allocator<double>> *)&this->parameters,iVar5,
               this->states + uVar16);
  }
  else {
    *iVar5._M_current = this->states[uVar16];
    (this->parameters).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar5._M_current + 1;
  }
  piVar6 = (this->changepoints).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar7 = (this->changepoints).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  piVar12 = piVar7 + -1;
  if (piVar6 < piVar12 && piVar6 != piVar7) {
    do {
      piVar10 = piVar6 + 1;
      iVar2 = *piVar6;
      *piVar6 = *piVar12;
      *piVar12 = iVar2;
      piVar12 = piVar12 + -1;
      piVar6 = piVar10;
    } while (piVar10 < piVar12);
  }
  pdVar8 = (this->parameters).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar9 = (this->parameters).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pdVar13 = pdVar9 + -1;
  if (pdVar8 < pdVar13 && pdVar8 != pdVar9) {
    do {
      pdVar11 = pdVar8 + 1;
      dVar17 = *pdVar8;
      *pdVar8 = *pdVar13;
      *pdVar13 = dVar17;
      pdVar13 = pdVar13 + -1;
      pdVar8 = pdVar11;
    } while (pdVar11 < pdVar13);
  }
  return;
}

Assistant:

void OmegaOP::backtracking(unsigned int n)
{
  unsigned int p = nbStates;
  double temp_Q = Q[0][n];
  unsigned int temp_indState = 0;

  for(unsigned int v = 1; v < p; v++)
  {
    if(Q[v][n] < temp_Q)
    {
      temp_Q = Q[v][n];
      temp_indState = v;
    }
  }

  globalCost = Q[temp_indState][n]; ///fill the globalCost OmegaOP variable
  unsigned int temp_chpt = n;

  while(temp_chpt > 1)
  {
    changepoints.push_back(temp_chpt);
    parameters.push_back(states[temp_indState]);

    temp_chpt = lastChpt[temp_indState][temp_chpt];
    temp_indState = lastIndState[temp_indState][changepoints[changepoints.size()-1]];
  }

  changepoints.push_back(1);
  parameters.push_back(states[temp_indState]);

  ///reverse the vector
  std::reverse(changepoints.begin(), changepoints.end());
  std::reverse(parameters.begin(), parameters.end());
}